

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValues_Test::testBody
          (TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValues_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  ulong uVar5;
  undefined4 extraout_var_01;
  TestTerminator *pTVar6;
  undefined4 extraout_var_02;
  SimpleString local_208;
  MockNamedValue local_1f8;
  SimpleString local_1a8;
  SimpleString local_198;
  MockNamedValue local_188;
  SimpleString local_138;
  MockNamedValue local_128;
  SimpleString local_d8;
  SimpleString local_c8;
  MockNamedValue local_b8;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  uint local_18;
  uint local_14;
  uint another_expected_value;
  uint expected_value;
  TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValues_Test *this_local;
  
  local_14 = 1;
  local_18 = 2;
  _another_expected_value = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_48);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd0))
            ((long *)CONCAT44(extraout_var,iVar1),local_14);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_58,"");
  pMVar3 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_68);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xd0))
            ((long *)CONCAT44(extraout_var_00,iVar1),local_18);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_14;
  SimpleString::SimpleString(&local_c8,"");
  pMVar3 = mock(&local_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d8,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_d8);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0xa8))(&local_b8);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_b8);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(expected_value, mock().actualCall(\"foo\").returnValue().getUnsignedIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xc6,pTVar6);
  MockNamedValue::~MockNamedValue(&local_b8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_14;
  SimpleString::SimpleString(&local_138,"");
  pMVar3 = mock(&local_138,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_128);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_128);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(expected_value, mock().returnValue().getUnsignedIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,199,pTVar6);
  MockNamedValue::~MockNamedValue(&local_128);
  SimpleString::~SimpleString(&local_138);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_18;
  SimpleString::SimpleString(&local_198,"");
  pMVar3 = mock(&local_198,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1a8,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_1a8);
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0xa8))(&local_188);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_188);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(another_expected_value, mock().actualCall(\"foo\").returnValue().getUnsignedIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,200,pTVar6);
  MockNamedValue::~MockNamedValue(&local_188);
  SimpleString::~SimpleString(&local_1a8);
  SimpleString::~SimpleString(&local_198);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_18;
  SimpleString::SimpleString(&local_208,"");
  pMVar3 = mock(&local_208,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_1f8);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_1f8);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(another_expected_value, mock().returnValue().getUnsignedIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xc9,pTVar6);
  MockNamedValue::~MockNamedValue(&local_1f8);
  SimpleString::~SimpleString(&local_208);
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedIntegerReturnValueSetsDifferentValues)
{
    unsigned int expected_value = 1;
    unsigned int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedIntValue());
    LONGS_EQUAL(expected_value, mock().returnValue().getUnsignedIntValue());
    LONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getUnsignedIntValue());
    LONGS_EQUAL(another_expected_value, mock().returnValue().getUnsignedIntValue());
}